

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O2

lyd_diff_op lyd_diff_str2op(char *str)

{
  char cVar1;
  uint __line;
  int iVar2;
  lyd_diff_op lVar3;
  char *__assertion;
  
  cVar1 = *str;
  if (cVar1 == 'r') {
    iVar2 = strcmp(str,"replace");
    if (iVar2 != 0) {
      __assertion = "!strcmp(str, \"replace\")";
      __line = 0x62;
LAB_00118e91:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    __line,"enum lyd_diff_op lyd_diff_str2op(const char *)");
    }
    lVar3 = LYD_DIFF_OP_REPLACE;
  }
  else if (cVar1 == 'd') {
    iVar2 = strcmp(str,"delete");
    if (iVar2 != 0) {
      __assertion = "!strcmp(str, \"delete\")";
      __line = 0x5f;
      goto LAB_00118e91;
    }
    lVar3 = LYD_DIFF_OP_DELETE;
  }
  else if (cVar1 == 'n') {
    iVar2 = strcmp(str,"none");
    if (iVar2 != 0) {
      __assertion = "!strcmp(str, \"none\")";
      __line = 0x65;
      goto LAB_00118e91;
    }
    lVar3 = LYD_DIFF_OP_NONE;
  }
  else if (cVar1 == 'c') {
    iVar2 = strcmp(str,"create");
    lVar3 = LYD_DIFF_OP_CREATE;
    if (iVar2 != 0) {
      __assertion = "!strcmp(str, \"create\")";
      __line = 0x5c;
      goto LAB_00118e91;
    }
  }
  else {
    lVar3 = LYD_DIFF_OP_CREATE;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x69);
  }
  return lVar3;
}

Assistant:

static enum lyd_diff_op
lyd_diff_str2op(const char *str)
{
    switch (str[0]) {
    case 'c':
        assert(!strcmp(str, "create"));
        return LYD_DIFF_OP_CREATE;
    case 'd':
        assert(!strcmp(str, "delete"));
        return LYD_DIFF_OP_DELETE;
    case 'r':
        assert(!strcmp(str, "replace"));
        return LYD_DIFF_OP_REPLACE;
    case 'n':
        assert(!strcmp(str, "none"));
        return LYD_DIFF_OP_NONE;
    }

    LOGINT(NULL);
    return 0;
}